

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

bool __thiscall roaring::Roaring64Map::isSubset(Roaring64Map *this,Roaring64Map *r)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  _Bool _Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  bool bVar8;
  
  p_Var4 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var7) {
    p_Var1 = &(r->roarings)._M_t._M_impl.super__Rb_tree_header;
    do {
      _Var3 = roaring_bitmap_is_empty((roaring_bitmap_t *)&p_Var4[1]._M_parent);
      if (!_Var3) {
        p_Var5 = (r->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var5 == (_Base_ptr)0x0) {
          return false;
        }
        _Var2 = p_Var4[1]._M_color;
        p_Var6 = &p_Var1->_M_header;
        do {
          bVar8 = (_Rb_tree_color)*(size_t *)(p_Var5 + 1) < _Var2;
          if (!bVar8) {
            p_Var6 = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[bVar8];
        } while (p_Var5 != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var6 == p_Var1) {
          return false;
        }
        if (_Var2 < (_Rb_tree_color)((_Rb_tree_header *)p_Var6)->_M_node_count) {
          return false;
        }
        _Var3 = roaring_bitmap_is_subset
                          ((roaring_bitmap_t *)&p_Var4[1]._M_parent,
                           (roaring_bitmap_t *)((long)p_Var6 + 0x28));
        if (!_Var3) {
          return false;
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var7);
  }
  return true;
}

Assistant:

bool isSubset(const Roaring64Map &r) const {
        for (const auto &map_entry : roarings) {
            if (map_entry.second.isEmpty()) {
                continue;
            }
            auto roaring_iter = r.roarings.find(map_entry.first);
            if (roaring_iter == r.roarings.cend())
                return false;
            else if (!map_entry.second.isSubset(roaring_iter->second))
                return false;
        }
        return true;
    }